

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int m_eq_1(char *z)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  
  pcVar4 = z + 1;
  do {
    pcVar3 = pcVar4;
    cVar1 = pcVar3[-1];
    lVar6 = (long)cVar1;
    if (lVar6 == 0) {
      iVar2 = 0;
    }
    else if (lVar6 == 0x79) {
      iVar2 = isConsonant(pcVar3);
    }
    else {
      iVar2 = 1 - (char)(&DAT_001dedaf)[lVar6];
    }
    pcVar4 = pcVar3 + 1;
  } while (iVar2 != 0);
  uVar5 = 0;
  if (cVar1 != '\0') {
    pcVar4 = pcVar3 + -4;
    do {
      pcVar3 = pcVar4;
      iVar2 = isConsonant(pcVar3 + 3);
      pcVar4 = pcVar3 + 1;
    } while (iVar2 != 0);
    if (pcVar3[3] != '\0') {
      do {
        cVar1 = pcVar4[2];
        lVar6 = (long)cVar1;
        if (lVar6 == 0) {
          iVar2 = 0;
        }
        else if (lVar6 == 0x79) {
          iVar2 = isConsonant(pcVar4 + 3);
        }
        else {
          iVar2 = 1 - (char)(&DAT_001dedaf)[lVar6];
        }
        pcVar4 = pcVar4 + 1;
      } while (iVar2 != 0);
      if (cVar1 == '\0') {
        uVar5 = 1;
      }
      else {
        do {
          pcVar4 = pcVar4 + 1;
          iVar2 = isConsonant(pcVar4);
        } while (iVar2 != 0);
        uVar5 = (uint)(*pcVar4 == '\0');
      }
    }
  }
  return uVar5;
}

Assistant:

static int m_eq_1(const char *z){
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 1;
  while( isConsonant(z) ){ z++; }
  return *z==0;
}